

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O3

void __thiscall Colony::update_phero_matrix(Colony *this,double *total_tour_distance)

{
  pointer pNVar1;
  double **ppdVar2;
  Car *pCVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double tour_distance;
  double local_50;
  vector<Node,_std::allocator<Node>_> local_48;
  
  if (0 < (this->super_Graph).num_car) {
    pCVar3 = (this->super_Graph).cars;
    lVar7 = 0;
    do {
      local_50 = 0.0;
      std::vector<Node,_std::allocator<Node>_>::vector(&local_48,&pCVar3[lVar7].tour);
      Graph::calc_tour_distance(&this->super_Graph,&local_48,&local_50);
      if (local_48.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      *total_tour_distance = local_50 + *total_tour_distance;
      pCVar3 = (this->super_Graph).cars;
      pNVar1 = pCVar3[lVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)pCVar3[lVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pNVar1;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 5;
        ppdVar2 = this->phero_matrix;
        piVar4 = &pNVar1[1].idx;
        lVar6 = 0;
        do {
          if (lVar5 + -1 != lVar6) {
            ppdVar2[piVar4[-8]][*piVar4] = ppdVar2[piVar4[-8]][*piVar4] * 0.9 + 1.0 / local_50;
          }
          lVar6 = lVar6 + 1;
          piVar4 = piVar4 + 8;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->super_Graph).num_car);
  }
  return;
}

Assistant:

void Colony::update_phero_matrix(double &total_tour_distance)
{
	for (int i = 0; i < num_car; i++){
		double tour_distance = 0.0;
		calc_tour_distance(cars[i].tour, tour_distance);
		total_tour_distance += tour_distance;
		for (int j = 0; j < cars[i].tour.size(); j++){
			if(j+1 != cars[i].tour.size()){
				phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] = evap_rate * phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] + q / tour_distance;
			} 
		}
	}
}